

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O1

char * rapidjson::internal::u32toa(uint32_t value,char *buffer)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  
  if (value < 10000) {
    uVar3 = value / 100 + value / 100;
    if (999 < value) {
      *buffer = GetDigitsLut()::cDigitsLut[uVar3];
      buffer = buffer + 1;
    }
    if (99 < value) {
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
      buffer = buffer + 1;
    }
    uVar3 = (value % 100) * 2;
    if (9 < value) {
      *buffer = GetDigitsLut()::cDigitsLut[uVar3];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
    return buffer + 1;
  }
  if (value < 100000000) {
    uVar3 = value / 500000 & 0xfffffffe;
    if (9999999 < value) {
      *buffer = GetDigitsLut()::cDigitsLut[uVar3];
      buffer = buffer + 1;
    }
    uVar4 = (ulong)(((value % 10000) / 100) * 2);
    uVar1 = ((value % 10000) % 100) * 2;
    if (999999 < value) {
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
      buffer = buffer + 1;
    }
    uVar3 = (value / 10000 + (value / 1000000) * -100) * 2;
    if (99999 < value) {
      *buffer = GetDigitsLut()::cDigitsLut[uVar3];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
    buffer[1] = GetDigitsLut()::cDigitsLut[uVar4];
    buffer[2] = GetDigitsLut()::cDigitsLut[uVar4 + 1];
    buffer[3] = GetDigitsLut()::cDigitsLut[uVar1];
    buffer[4] = GetDigitsLut()::cDigitsLut[(ulong)uVar1 + 1];
    return buffer + 5;
  }
  uVar4 = (ulong)value / 100000000;
  uVar3 = value + (int)uVar4 * -100000000;
  if (value < 1000000000) {
    *buffer = (byte)((ulong)value / 100000000) | 0x30;
    pcVar2 = buffer + 1;
  }
  else {
    *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + uVar4 * 2);
    pcVar2 = buffer + 2;
  }
  *(undefined2 *)pcVar2 =
       *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar3 / 500000 & 0xfffffffe));
  *(undefined2 *)(pcVar2 + 2) =
       *(undefined2 *)
        (GetDigitsLut()::cDigitsLut + (ulong)(uVar3 / 10000 + (uVar3 / 1000000) * -100) * 2);
  *(undefined2 *)(pcVar2 + 4) =
       *(undefined2 *)(GetDigitsLut()::cDigitsLut + ((ulong)(uVar3 % 10000) / 100) * 2);
  *(undefined2 *)(pcVar2 + 6) =
       *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)((uVar3 % 10000) % 100) * 2);
  return pcVar2 + 8;
}

Assistant:

inline char* u32toa(uint32_t value, char* buffer) {
    const char* cDigitsLut = GetDigitsLut();

    if (value < 10000) {
        const uint32_t d1 = (value / 100) << 1;
        const uint32_t d2 = (value % 100) << 1;
        
        if (value >= 1000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 100)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 10)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
    }
    else if (value < 100000000) {
        // value = bbbbcccc
        const uint32_t b = value / 10000;
        const uint32_t c = value % 10000;
        
        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;
        
        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;
        
        if (value >= 10000000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 1000000)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 100000)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    else {
        // value = aabbbbcccc in decimal
        
        const uint32_t a = value / 100000000; // 1 to 42
        value %= 100000000;
        
        if (a >= 10) {
            const unsigned i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));

        const uint32_t b = value / 10000; // 0 to 9999
        const uint32_t c = value % 10000; // 0 to 9999
        
        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;
        
        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;
        
        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    return buffer;
}